

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableModel::updateRowIndexes
          (QTableModel *this,QModelIndexList *indexes,int movedFromRow,int movedToRow)

{
  bool bVar1;
  int iVar2;
  iterator o;
  QModelIndex *pQVar3;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  long in_FS_OFFSET;
  int newRow;
  int oldRow;
  iterator it;
  int in_stack_ffffffffffffff80;
  int iVar4;
  int in_stack_ffffffffffffff84;
  int iVar5;
  undefined1 local_48 [24];
  undefined8 local_30;
  quintptr local_28;
  QAbstractItemModel *local_20;
  QModelIndex *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::iterator::iterator(&local_10);
  local_18 = (QModelIndex *)
             QList<QModelIndex>::begin
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_10 = (iterator)local_18;
  while( true ) {
    o = QList<QModelIndex>::end
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar1 = QList<QModelIndex>::iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    pQVar3 = QList<QModelIndex>::iterator::operator*(&local_10);
    iVar2 = QModelIndex::row(pQVar3);
    iVar4 = in_ECX;
    if (iVar2 != in_EDX) {
      if ((in_EDX < iVar2) && (iVar2 <= in_ECX)) {
        iVar4 = iVar2 + -1;
      }
      else {
        iVar4 = iVar2;
        if ((iVar2 < in_EDX) && (in_ECX <= iVar2)) {
          iVar4 = iVar2 + 1;
        }
      }
    }
    if (iVar4 != iVar2) {
      iVar5 = iVar4;
      pQVar3 = QList<QModelIndex>::iterator::operator*(&local_10);
      in_stack_ffffffffffffff84 = QModelIndex::column(pQVar3);
      QList<QModelIndex>::iterator::operator*(&local_10);
      QModelIndex::parent((QModelIndex *)CONCAT44(iVar2,iVar5));
      (**(code **)(*in_RDI + 0x60))(&local_30,in_RDI,iVar4,in_stack_ffffffffffffff84,local_48);
      pQVar3 = QList<QModelIndex>::iterator::operator*(&local_10);
      pQVar3->r = (undefined4)local_30;
      pQVar3->c = local_30._4_4_;
      pQVar3->i = local_28;
      (pQVar3->m).ptr = local_20;
      in_stack_ffffffffffffff80 = iVar4;
    }
    QList<QModelIndex>::iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::updateRowIndexes(QModelIndexList &indexes,
                                   int movedFromRow, int movedToRow)
{
    QModelIndexList::iterator it;
    for (it = indexes.begin(); it != indexes.end(); ++it) {
        int oldRow = (*it).row();
        int newRow = oldRow;
        if (oldRow == movedFromRow)
            newRow = movedToRow;
        else if (movedFromRow < oldRow && movedToRow >= oldRow)
            newRow = oldRow - 1;
        else if (movedFromRow > oldRow && movedToRow <= oldRow)
            newRow = oldRow + 1;
        if (newRow != oldRow)
            *it = index(newRow, (*it).column(), (*it).parent());
    }
}